

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

bool __thiscall Minisat::DoubleOption::parse(DoubleOption *this,char *str)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  int *piVar6;
  int *piVar7;
  uint uVar8;
  char cVar9;
  char *pcVar10;
  char **ppcVar11;
  bool bVar12;
  double dVar13;
  char *end;
  char *local_20;
  
  if (*str != '-') {
    return false;
  }
  pcVar10 = (this->super_Option).name;
  lVar4 = 0;
  cVar9 = *pcVar10;
  while (cVar9 != '\0') {
    if (str[lVar4 + 1] != cVar9) {
      return false;
    }
    lVar3 = lVar4 + 1;
    lVar4 = lVar4 + 1;
    cVar9 = pcVar10[lVar3];
  }
  if (str[lVar4 + 1] != '=') {
    return false;
  }
  pcVar10 = str + lVar4 + 2;
  dVar13 = strtod(pcVar10,&local_20);
  bVar12 = local_20 != (char *)0x0;
  if (!bVar12) {
    return bVar12;
  }
  ppcVar11 = &(this->super_Option).name;
  dVar1 = (this->range).end;
  if (dVar1 <= dVar13) {
    if ((this->range).end_inclusive == true) {
      if ((dVar13 == dVar1) && (!NAN(dVar13) && !NAN(dVar1))) goto LAB_0010c6ff;
    }
    parse();
  }
  else {
LAB_0010c6ff:
    dVar1 = (this->range).begin;
    if (dVar1 < dVar13) {
LAB_0010c71a:
      this->value = dVar13;
      return bVar12;
    }
    if ((this->range).begin_inclusive == true) {
      if ((dVar13 == dVar1) && (!NAN(dVar13) && !NAN(dVar1))) goto LAB_0010c71a;
    }
  }
  parse();
  uVar2 = *(uint *)((long)ppcVar11 + 0xc);
  uVar8 = uVar2;
  if ((uint)pcVar10 <= uVar2) {
    return (bool)(char)uVar2;
  }
  do {
    if ((uint)pcVar10 <= uVar8) {
      piVar6 = (int *)realloc(*ppcVar11,(ulong)uVar8 << 2);
      piVar7 = piVar6;
      if ((piVar6 != (int *)0x0) || (piVar7 = __errno_location(), *piVar7 != 0xc)) {
        *ppcVar11 = (char *)piVar6;
        return (bool)(char)piVar7;
      }
      break;
    }
    uVar8 = uVar8 + ((uVar8 >> 3) + (uVar8 >> 1) & 0xfffffffe) + 2;
    *(uint *)((long)ppcVar11 + 0xc) = uVar8;
  } while (uVar2 < uVar8);
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&OutOfMemoryException::typeinfo,0);
}

Assistant:

Int64Range(int64_t b, int64_t e) : begin(b), end(e) {}